

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<std::vector<bool,_std::allocator<bool>_>,_std::unique_ptr<std::vector<bool,_std::allocator<bool>_>,_std::default_delete<std::vector<bool,_std::allocator<bool>_>_>_>_>
* __thiscall
pybind11::
class_<std::vector<bool,std::allocator<bool>>,std::unique_ptr<std::vector<bool,std::allocator<bool>>,std::default_delete<std::vector<bool,std::allocator<bool>>>>>
::def<unsigned_long(std::vector<bool,std::allocator<bool>>::*)()const>
          (class_<std::vector<bool,std::allocator<bool>>,std::unique_ptr<std::vector<bool,std::allocator<bool>>,std::default_delete<std::vector<bool,std::allocator<bool>>>>>
           *this,char *name_,
          offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr *f)

{
  offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr f_00;
  name *extra;
  cpp_function cf;
  handle local_58;
  cpp_function local_50;
  object local_48;
  sibling local_40;
  is_method local_38;
  PyObject *local_30;
  
  f_00 = *f;
  extra = (name *)f[1];
  local_40.value.m_ptr = *(handle *)this;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_38.class_.m_ptr = (handle)(handle)name_;
  local_58.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_58.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_58.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_30 = local_58.m_ptr;
  cpp_function::
  cpp_function<unsigned_long,std::vector<bool,std::allocator<bool>>,,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_50,f_00,extra,&local_38,&local_40);
  object::~object((object *)&local_58);
  object::~object(&local_48);
  detail::add_class_method((object *)this,name_,&local_50);
  object::~object((object *)&local_50);
  return (class_<std::vector<bool,_std::allocator<bool>_>,_std::unique_ptr<std::vector<bool,_std::allocator<bool>_>,_std::default_delete<std::vector<bool,_std::allocator<bool>_>_>_>_>
          *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }